

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# secant.c
# Opt level: O2

void bfgs_naive(double *H,int N,double eps,double *xi,double *xf,double *jac,double *jacf)

{
  size_t __size;
  bool bVar1;
  double *C;
  double *C_00;
  double *C_01;
  double *C_02;
  double *B;
  ulong uVar2;
  ulong uVar3;
  double *pdVar4;
  ulong uVar5;
  double *pdVar6;
  double *pdVar7;
  double *pdVar8;
  ulong uVar9;
  long lVar10;
  ulong uVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  
  lVar10 = (long)N;
  __size = lVar10 * 8;
  C = (double *)malloc(__size);
  C_00 = (double *)malloc(__size);
  C_01 = (double *)malloc(8);
  C_02 = (double *)malloc(8);
  B = (double *)malloc(__size);
  msub(xf,xi,C,1,N);
  msub(jacf,jac,C_00,1,N);
  dVar12 = l2norm(C,N);
  dVar13 = l2norm(C_00,N);
  if (eps < 0.0) {
    dVar14 = sqrt(eps);
  }
  else {
    dVar14 = SQRT(eps);
  }
  bVar1 = true;
  mmult(C_00,C,C_01,1,N,1);
  if (dVar13 * dVar12 * dVar14 <= *C_01) {
    uVar2 = 0;
    if (0 < N) {
      uVar2 = (ulong)(uint)N;
    }
    uVar11 = (ulong)(uint)N;
    pdVar4 = C;
    uVar5 = uVar11;
    pdVar6 = H;
    pdVar7 = H;
    for (uVar3 = 0; uVar3 != uVar2; uVar3 = uVar3 + 1) {
      B[uVar3] = 0.0;
      dVar12 = 0.0;
      pdVar8 = pdVar7;
      for (uVar9 = 0; uVar3 != uVar9; uVar9 = uVar9 + 1) {
        dVar12 = dVar12 + *pdVar8 * C[uVar9];
        B[uVar3] = dVar12;
        pdVar8 = pdVar8 + lVar10;
      }
      for (uVar9 = 0; uVar5 != uVar9; uVar9 = uVar9 + 1) {
        dVar12 = dVar12 + pdVar6[uVar9] * pdVar4[uVar9];
        B[uVar3] = dVar12;
      }
      dVar13 = jac[uVar3];
      if (jac[uVar3] <= jacf[uVar3]) {
        dVar13 = jacf[uVar3];
      }
      if (dVar13 * dVar14 <= ABS(C_00[uVar3] - dVar12)) {
        bVar1 = false;
      }
      pdVar7 = pdVar7 + 1;
      pdVar6 = pdVar6 + lVar10 + 1;
      uVar5 = uVar5 - 1;
      pdVar4 = pdVar4 + 1;
    }
    if (!bVar1) {
      mmult(C,B,C_02,1,N,1);
      pdVar4 = C_00;
      pdVar6 = B;
      for (uVar5 = 0; uVar5 != uVar2; uVar5 = uVar5 + 1) {
        for (uVar3 = 0; uVar11 != uVar3; uVar3 = uVar3 + 1) {
          H[uVar3] = ((C_00[uVar5] * pdVar4[uVar3]) / *C_01 + H[uVar3]) -
                     (B[uVar5] * pdVar6[uVar3]) / *C_02;
        }
        H = H + lVar10 + 1;
        uVar11 = uVar11 - 1;
        pdVar6 = pdVar6 + 1;
        pdVar4 = pdVar4 + 1;
      }
    }
  }
  free(C);
  free(C_00);
  free(C_01);
  free(C_02);
  free(B);
  return;
}

Assistant:

void bfgs_naive(double *H,int N,double eps,double *xi,double *xf,double *jac,double *jacf) {
	int i,j,supd,ct;
	double sn,yn,fd,yt,jacm;
	double *sk,*yk,*temp,*temp2,*t;
	
	sk = (double*) malloc(sizeof(double) *N);
	yk = (double*) malloc(sizeof(double) *N);
	temp = (double*) malloc(sizeof(double) *1);
	temp2 = (double*) malloc(sizeof(double) *1);
	t = (double*) malloc(sizeof(double) *N);
	
	msub(xf,xi,sk,1,N);
	msub(jacf,jac,yk,1,N);
	
	sn = l2norm(sk,N);
	yn = l2norm(yk,N);
	fd = sqrt(eps);
	
	mmult(yk,sk,temp,1,N,1);
	
	if (temp[0] >= fd*sn*yn) {
		supd = 1;
		for(i = 0; i < N;++i) {
			t[i] = 0.0;
			for(j = 0; j < i;++j) {
				ct = j * N;
				t[i] += H[ct+i] * sk[j];
			}
			
			for(j = i; j < N;++j) {
				ct = i * N;
				t[i] += H[ct + j] * sk[j];
			}
			yt = fabs(yk[i] - t[i]);
			if (jac[i] > jacf[i]) {
				jacm = jac[i];
			} else {
				jacm = jacf[i];
			}
			if (yt >= fd * jacm) {
				supd = 0;
			}
		}
		if (supd == 0) {
			mmult(sk,t,temp2,1,N,1);
			for(i = 0;i < N; ++i) {
				ct = i * N;
				for(j = i; j < N;++j) {
					H[ct+j] += (yk[i]*yk[j]/temp[0]);
					H[ct+j] -= (t[i]*t[j]/temp2[0]);
				}
			}
		} 
	} 
	
	free(sk);
	free(yk);
	free(temp);
	free(temp2);
	free(t);
}